

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<void*>,testing::Matcher<unsigned_long>>,std::tuple<void*,unsigned_long>>
               (tuple<testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_> *matchers,
               tuple<void_*,_unsigned_long> *values,ostream *os)

{
  void *pvVar1;
  MatcherInterface<void_*> *pMVar2;
  linked_ptr_internal lVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  type matcher;
  StringMatchResultListener listener;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  undefined **local_1e0;
  linked_ptr<const_testing::MatcherInterface<void_*>_> local_1d8;
  undefined **local_1c8;
  undefined1 *local_1c0;
  stringstream asStack_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = &PTR__MatcherBase_001e79b8;
  local_1d8.value_ =
       (matchers->super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>
       ).super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl.
       super_MatcherBase<void_*>.impl_.value_;
  lVar3.next_ = &local_1d8.link_;
  if (local_1d8.value_ != (MatcherInterface<void_*> *)0x0) {
    linked_ptr_internal::join
              (&local_1d8.link_,
               &(matchers->
                super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>).
                super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl.
                super_MatcherBase<void_*>.impl_.link_);
    lVar3.next_ = local_1d8.link_.next_;
  }
  local_1d8.link_.next_ = lVar3.next_;
  local_1e0 = &PTR__MatcherBase_001e7970;
  local_1c0 = (undefined1 *)0x0;
  if (asStack_1b8 != (stringstream *)0x0) {
    local_1c0 = local_1a8;
  }
  pvVar1 = (values->super__Tuple_impl<0UL,_void_*,_unsigned_long>).
           super__Head_base<0UL,_void_*,_false>._M_head_impl;
  local_1c8 = &PTR__StringMatchResultListener_001e2290;
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  cVar4 = (**(code **)(*(long *)local_1d8.value_ + 0x20))(local_1d8.value_,pvVar1,&local_1c8);
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    pMVar2 = (matchers->
             super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>).
             super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl.
             super_MatcherBase<void_*>.impl_.value_;
    (**(code **)(*(long *)pMVar2 + 0x10))(pMVar2,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    DefaultPrintTo<void>(0,pvVar1,os);
    std::__cxx11::stringbuf::str();
    iVar5 = std::__cxx11::string::compare((char *)&local_200);
    if ((os != (ostream *)0x0) && (iVar5 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_200,local_1f8);
    }
    if (local_200 != local_1f0) {
      operator_delete(local_200,local_1f0[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_1c8 = &PTR__StringMatchResultListener_001e2290;
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  local_1e0 = &PTR__MatcherBase_001e79b8;
  linked_ptr<const_testing::MatcherInterface<void_*>_>::~linked_ptr(&local_1d8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }